

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmListFileFunction *lff,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *lff_00
  ;
  string *fileName;
  cmake *args;
  undefined1 local_178 [136];
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  cmListFileContext local_a8;
  cmListFileContext *local_38;
  cmListFileContext *lfc;
  cmExecutionStatus *status_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *deferId_local;
  cmListFileFunction *lff_local;
  cmMakefile *mf_local;
  cmMakefileCall *this_local;
  
  this->Makefile = mf;
  lfc = (cmListFileContext *)status;
  status_local = (cmExecutionStatus *)deferId;
  deferId_local =
       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )lff;
  lff_local = (cmListFileFunction *)mf;
  mf_local = (cmMakefile *)this;
  std::optional<cmMakefileProfilingData::RAII>::optional(&this->ProfilingDataRAII);
  lff_00 = deferId_local;
  fileName = cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&this->Makefile->StateSnapshot);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&local_e0,deferId);
  cmListFileContext::FromListFileFunction(&local_a8,(cmListFileFunction *)lff_00,fileName,&local_e0)
  ;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_e0);
  local_38 = &local_a8;
  pcVar1 = this->Makefile;
  cmListFileContext::cmListFileContext((cmListFileContext *)(local_178 + 0x18),local_38);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&local_f0,(cmListFileContext *)&pcVar1->Backtrace);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,(cmListFileBacktrace *)&local_f0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_f0);
  cmListFileContext::~cmListFileContext((cmListFileContext *)(local_178 + 0x18));
  this->Makefile->RecursionDepth = this->Makefile->RecursionDepth + 1;
  local_178._16_8_ = lfc;
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::push_back
            (&this->Makefile->ExecutionStatusStack,(value_type *)(local_178 + 0x10));
  args = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::CreateProfilingEntry<cmListFileFunction_const&,cmListFileContext_const&>
            ((cmake *)local_178,(cmListFileFunction *)args,(cmListFileContext *)deferId_local);
  std::optional<cmMakefileProfilingData::RAII>::operator=
            (&this->ProfilingDataRAII,(optional<cmMakefileProfilingData::RAII> *)local_178);
  std::optional<cmMakefileProfilingData::RAII>::~optional
            ((optional<cmMakefileProfilingData::RAII> *)local_178);
  cmListFileContext::~cmListFileContext(&local_a8);
  return;
}

Assistant:

cmMakefileCall(cmMakefile* mf, cmListFileFunction const& lff,
                 cm::optional<std::string> deferId, cmExecutionStatus& status)
    : Makefile(mf)
  {
    cmListFileContext const& lfc = cmListFileContext::FromListFileFunction(
      lff, this->Makefile->StateSnapshot.GetExecutionListFile(),
      std::move(deferId));
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(lfc);
    ++this->Makefile->RecursionDepth;
    this->Makefile->ExecutionStatusStack.push_back(&status);
#if !defined(CMAKE_BOOTSTRAP)
    this->ProfilingDataRAII =
      this->Makefile->GetCMakeInstance()->CreateProfilingEntry(lff, lfc);
#endif
  }